

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

natwm_error string_find_first_nonspace(char *string,size_t *index_result)

{
  char cVar1;
  ushort **ppuVar2;
  size_t sVar3;
  natwm_error nVar4;
  
  if (string == (char *)0x0) {
    nVar4 = INVALID_INPUT_ERROR;
  }
  else {
    nVar4 = NOT_FOUND_ERROR;
    for (sVar3 = 0; cVar1 = string[sVar3], (long)cVar1 != 0; sVar3 = sVar3 + 1) {
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        *index_result = sVar3;
        return NO_ERROR;
      }
    }
  }
  return nVar4;
}

Assistant:

enum natwm_error string_find_first_nonspace(const char *string, size_t *index_result)
{
        if (string == NULL) {
                return INVALID_INPUT_ERROR;
        }

        char ch = '\0';
        size_t index = 0;

        while ((ch = string[index]) != '\0' && isspace(ch)) {
                ++index;
        }

        if (ch == '\0') {
                // Reached the end of the line without finding a nonspace char
                return NOT_FOUND_ERROR;
        }

        *index_result = index;

        return NO_ERROR;
}